

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TypeSpecializeUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,Value *src1OriginalVal,
          bool *redoTypeSpecRef,bool *forceInvariantHoistingRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueInfo *pVVar4;
  int32 local_58;
  int32 local_54;
  int32 max;
  int32 min;
  Instr **instr;
  Value **src1Val;
  bool *redoTypeSpecRef_local;
  Value *src1OriginalVal_local;
  Value **pDstVal_local;
  Value **pSrc1Val_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  src1Val = (Value **)redoTypeSpecRef;
  redoTypeSpecRef_local = (bool *)src1OriginalVal;
  src1OriginalVal_local = (Value *)pDstVal;
  pDstVal_local = pSrc1Val;
  pSrc1Val_local = (Value **)pInstr;
  pInstr_local = (Instr **)this;
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1dbc,"(pSrc1Val)","pSrc1Val");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  instr = (Instr **)pDstVal_local;
  if (*pDstVal_local == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1dbe,"(src1Val)","src1Val");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsTypeSpecPhaseOff(this->func);
  if ((bVar2) || (bVar2 = GetIsAsmJSFunc(this), bVar2)) {
    this_local._7_1_ = false;
  }
  else {
    _max = (Instr **)pSrc1Val_local;
    bVar2 = OpCodeAttr::IsInlineBuiltIn((OpCode)(*pSrc1Val_local)[3].valueNumber);
    if (bVar2) {
      TypeSpecializeInlineBuiltInUnary
                (this,(Instr **)pSrc1Val_local,(Value **)instr,(Value **)src1OriginalVal_local,
                 (Value *)redoTypeSpecRef_local,(bool *)src1Val);
      this_local._7_1_ = true;
    }
    else if (((*_max)->m_opcode == LdLen_A) &&
            (bVar2 = TypeSpecializeLdLen(this,_max,(Value **)instr,(Value **)src1OriginalVal_local,
                                         forceInvariantHoistingRef), bVar2)) {
      this_local._7_1_ = true;
    }
    else {
      pVVar4 = ::Value::GetValueInfo((Value *)*instr);
      bVar2 = DoAggressiveIntTypeSpec(this);
      bVar2 = ValueInfo::GetIntValMinMax(pVVar4,&local_54,&local_58,bVar2);
      if (bVar2) {
        this_local._7_1_ =
             TypeSpecializeIntUnary
                       (this,(Instr **)pSrc1Val_local,(Value **)instr,
                        (Value **)src1OriginalVal_local,local_54,local_58,
                        (Value *)redoTypeSpecRef_local,(bool *)src1Val,false);
      }
      else {
        *instr = (Instr *)redoTypeSpecRef_local;
        pVVar4 = ::Value::GetValueInfo((Value *)*instr);
        bVar2 = ValueType::IsLikelyFloat(&pVVar4->super_ValueType);
        if (bVar2) {
          this_local._7_1_ =
               TypeSpecializeFloatUnary
                         (this,(Instr **)pSrc1Val_local,(Value *)*instr,
                          (Value **)src1OriginalVal_local,false);
        }
        else {
          pVVar4 = ::Value::GetValueInfo((Value *)*instr);
          bVar2 = ValueType::IsNumber(&pVVar4->super_ValueType);
          if (bVar2) {
            this_local._7_1_ =
                 TypeSpecializeNumberUnary
                           (this,*_max,(Value *)*instr,(Value **)src1OriginalVal_local);
          }
          else {
            this_local._7_1_ =
                 TryTypeSpecializeUnaryToFloatHelper
                           (this,(Instr **)pSrc1Val_local,(Value **)instr,
                            (Value *)redoTypeSpecRef_local,(Value **)src1OriginalVal_local);
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::TypeSpecializeUnary(
    IR::Instr **pInstr,
    Value **pSrc1Val,
    Value **pDstVal,
    Value *const src1OriginalVal,
    bool *redoTypeSpecRef,
    bool *const forceInvariantHoistingRef)
{
    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;
    Assert(src1Val);

    // We don't need to do typespec for asmjs
    if (IsTypeSpecPhaseOff(this->func) || GetIsAsmJSFunc())
    {
        return false;
    }

    IR::Instr *&instr = *pInstr;
    int32 min, max;

    // Inline built-ins explicitly specify how srcs/dst must be specialized.
    if (OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        TypeSpecializeInlineBuiltInUnary(pInstr, &src1Val, pDstVal, src1OriginalVal, redoTypeSpecRef);
        return true;
    }

    // Consider: If type spec wasn't completely done, make sure that we don't type-spec the dst 2nd time.
    if(instr->m_opcode == Js::OpCode::LdLen_A && TypeSpecializeLdLen(&instr, &src1Val, pDstVal, forceInvariantHoistingRef))
    {
        return true;
    }

    if (!src1Val->GetValueInfo()->GetIntValMinMax(&min, &max, this->DoAggressiveIntTypeSpec()))
    {
        src1Val = src1OriginalVal;
        if (src1Val->GetValueInfo()->IsLikelyFloat())
        {
            // Try to type specialize to float
            return this->TypeSpecializeFloatUnary(pInstr, src1Val, pDstVal);
        }
        else if (src1Val->GetValueInfo()->IsNumber())
        {
            return TypeSpecializeNumberUnary(instr, src1Val, pDstVal);
        }
        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
    }

    return this->TypeSpecializeIntUnary(pInstr, &src1Val, pDstVal, min, max, src1OriginalVal, redoTypeSpecRef);
}